

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::StoreVersionFound(cmFindPackageCommand *this)

{
  string ver;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  cmAlphaNum local_48;
  
  local_78._8_8_ = (this->Name)._M_dataplus._M_p;
  local_78._M_unused._0_8_ = (undefined8)(this->Name)._M_string_length;
  local_48.View_._M_len = 8;
  local_48.View_._M_str = "_VERSION";
  cmStrCat<>(&ver,(cmAlphaNum *)&local_78,&local_48);
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:2469:24)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx:2469:24)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  SetVersionVariables((cmFindPackageCommand *)(ulong)this->VersionFoundPatch,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_78,&ver,&this->VersionFound,this->VersionFoundCount,
                      this->VersionFoundMajor,this->VersionFoundMinor,this->VersionFoundPatch,
                      this->VersionFoundTweak);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  if ((this->VersionFound)._M_string_length == 0) {
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).Makefile,&ver);
  }
  std::__cxx11::string::~string((string *)&ver);
  return;
}

Assistant:

void cmFindPackageCommand::StoreVersionFound()
{
  // Store the whole version string.
  std::string const ver = cmStrCat(this->Name, "_VERSION");
  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->Makefile->AddDefinition(variable, value);
  };

  this->SetVersionVariables(addDefinition, ver, this->VersionFound,
                            this->VersionFoundCount, this->VersionFoundMajor,
                            this->VersionFoundMinor, this->VersionFoundPatch,
                            this->VersionFoundTweak);

  if (this->VersionFound.empty()) {
    this->Makefile->RemoveDefinition(ver);
  }
}